

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

void square_add_glyph(chunk *c,loc_conflict grid,wchar_t type)

{
  trap_kind_conflict1 *local_28;
  trap_kind *glyph;
  wchar_t type_local;
  chunk *c_local;
  loc_conflict grid_local;
  
  if (type == L'\x01') {
    local_28 = lookup_trap("glyph of warding");
  }
  else {
    if (type != L'\x02') {
      msg("Non-existent glyph requested. Please report this bug.");
      return;
    }
    local_28 = lookup_trap("decoy");
    c->decoy = grid;
  }
  place_trap((chunk_conflict2 *)c,grid,local_28->tidx,L'\0');
  return;
}

Assistant:

void square_add_glyph(struct chunk *c, struct loc grid, int type)
{
	struct trap_kind *glyph = NULL;
	switch (type) {
		case GLYPH_WARDING: {
			glyph = lookup_trap("glyph of warding");
			break;
		}
		case GLYPH_DECOY: {
			glyph = lookup_trap("decoy");
			c->decoy = grid;
			break;
		}
		default: {
			msg("Non-existent glyph requested. Please report this bug.");
			return;
		}
	}
	place_trap(c, grid, glyph->tidx, 0);
}